

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine_p.h
# Opt level: O3

void __thiscall
QOpenGL2PaintEngineExPrivate::QOpenGL2PaintEngineExPrivate
          (QOpenGL2PaintEngineExPrivate *this,QOpenGL2PaintEngineEx *q_ptr)

{
  QPaintEngineExPrivate::QPaintEngineExPrivate(&this->super_QPaintEngineExPrivate);
  *(undefined ***)this = &PTR__QOpenGL2PaintEngineExPrivate_001a0ed0;
  QOpenGLExtensions::QOpenGLExtensions(&this->funcs);
  this->q = q_ptr;
  this->shaderManager = (QOpenGLEngineShaderManager *)0x0;
  this->width = 0;
  this->height = 0;
  (this->ctx).wp.d = (Data *)0x0;
  (this->ctx).wp.value = (QObject *)0x0;
  this->useSystemClip = true;
  QRegion::QRegion(&this->dirtyStencilRegion);
  (this->currentScissorBounds).x1 = 0;
  (this->currentScissorBounds).y1 = 0;
  (this->currentScissorBounds).x2 = -1;
  (this->currentScissorBounds).y2 = -1;
  QBrush::QBrush(&this->currentBrush);
  QBrush::QBrush(&this->noBrush);
  QImage::QImage(&this->currentBrushImage);
  (this->vertexCoordinateArray).vertexArrayStops.siz = 0;
  (this->vertexCoordinateArray).vertexArrayStops.buffer = (int *)0x0;
  (this->vertexCoordinateArray).vertexArray.buffer = (QOpenGLPoint *)0x0;
  (this->vertexCoordinateArray).vertexArrayStops.capacity = 0;
  (this->vertexCoordinateArray).vertexArray.capacity = 0;
  (this->vertexCoordinateArray).vertexArray.siz = 0;
  (this->vertexCoordinateArray).maxX = -2e+10;
  (this->vertexCoordinateArray).maxY = -2e+10;
  (this->vertexCoordinateArray).minX = 2e+10;
  (this->vertexCoordinateArray).minY = 2e+10;
  (this->vertexCoordinateArray).boundingRectDirty = true;
  (this->textureCoordinateArray).vertexArray.capacity = 0;
  (this->textureCoordinateArray).vertexArray.siz = 0;
  (this->textureCoordinateArray).vertexArray.buffer = (QOpenGLPoint *)0x0;
  (this->textureCoordinateArray).vertexArrayStops.capacity = 0;
  (this->textureCoordinateArray).vertexArrayStops.siz = 0;
  (this->textureCoordinateArray).vertexArrayStops.buffer = (int *)0x0;
  (this->textureCoordinateArray).maxX = -2e+10;
  (this->textureCoordinateArray).maxY = -2e+10;
  (this->textureCoordinateArray).minX = 2e+10;
  (this->textureCoordinateArray).minY = 2e+10;
  (this->textureCoordinateArray).boundingRectDirty = true;
  this->snapToPixelGrid = false;
  this->nativePaintingActive = false;
  (this->elementIndices).d.d = (Data *)0x0;
  (this->elementIndices).d.ptr = (unsigned_short *)0x0;
  *(undefined8 *)((long)&(this->elementIndices).d.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->elementIndices).d.size + 4) = 0;
  (this->opacityArray).capacity = 0;
  (this->opacityArray).siz = 0;
  (this->opacityArray).buffer = (float *)0x0;
  this->inverseScale = 1.0;
  this->lastTextureUnitUsed = 0xffffffff;
  QOpenGLVertexArrayObject::QOpenGLVertexArrayObject(&this->vao,(QObject *)0x0);
  QOpenGLBuffer::QOpenGLBuffer(&this->vertexBuffer,VertexBuffer);
  QOpenGLBuffer::QOpenGLBuffer(&this->texCoordBuffer,VertexBuffer);
  QOpenGLBuffer::QOpenGLBuffer(&this->opacityBuffer,VertexBuffer);
  QOpenGLBuffer::QOpenGLBuffer(&this->indexBuffer,IndexBuffer);
  (this->stroker).m_nvx = 0.0;
  (this->stroker).m_nvy = 0.0;
  (this->stroker).m_vertices.buffer = (float *)0x0;
  (this->stroker).m_cx = 0.0;
  (this->stroker).m_cy = 0.0;
  (this->stroker).m_vertices.capacity = 0;
  (this->stroker).m_vertices.siz = 0;
  (this->stroker).m_width = 1.0;
  (this->stroker).m_miter_limit = 2.0;
  (this->stroker).m_roundness = 0;
  (this->stroker).m_sin_theta = 0.0;
  (this->stroker).m_cos_theta = 0.0;
  (this->stroker).m_inv_scale = 1.0;
  (this->stroker).m_curvyness_mul = 1.0;
  (this->stroker).m_curvyness_add = 0.0;
  (this->stroker).m_join_style = BevelJoin;
  (this->stroker).m_cap_style = SquareCap;
  QDashedStrokeProcessor::QDashedStrokeProcessor(&this->dasher);
  (this->unusedVBOSToClean).super_QVLABase<unsigned_int>.super_QVLABaseBase.a = 8;
  (this->unusedVBOSToClean).super_QVLABase<unsigned_int>.super_QVLABaseBase.s = 0;
  (this->unusedVBOSToClean).super_QVLABase<unsigned_int>.super_QVLABaseBase.ptr =
       &(this->unusedVBOSToClean).super_QVLAStorage<4UL,_4UL,_8LL>;
  (this->unusedIBOSToClean).super_QVLABase<unsigned_int>.super_QVLABaseBase.a = 8;
  (this->unusedIBOSToClean).super_QVLABase<unsigned_int>.super_QVLABaseBase.s = 0;
  (this->unusedIBOSToClean).super_QVLABase<unsigned_int>.super_QVLABaseBase.ptr =
       &(this->unusedIBOSToClean).super_QVLAStorage<4UL,_4UL,_8LL>;
  return;
}

Assistant:

QOpenGL2PaintEngineExPrivate(QOpenGL2PaintEngineEx *q_ptr) :
            q(q_ptr),
            shaderManager(nullptr),
            width(0), height(0),
            ctx(nullptr),
            useSystemClip(true),
            elementIndicesVBOId(0),
            opacityArray(0),
            snapToPixelGrid(false),
            nativePaintingActive(false),
            inverseScale(1),
            lastTextureUnitUsed(QT_UNKNOWN_TEXTURE_UNIT),
            vertexBuffer(QOpenGLBuffer::VertexBuffer),
            texCoordBuffer(QOpenGLBuffer::VertexBuffer),
            opacityBuffer(QOpenGLBuffer::VertexBuffer),
            indexBuffer(QOpenGLBuffer::IndexBuffer)
    { }